

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
MeshLib::List<MeshLib::Token>::append(List<MeshLib::Token> *this,ListNode<MeshLib::Token> *tn)

{
  ListNode<MeshLib::Token> **ppLVar1;
  ListNode<MeshLib::Token> *local_20;
  ListNode<MeshLib::Token> *n;
  ListNode<MeshLib::Token> *tn_local;
  List<MeshLib::Token> *this_local;
  
  if (this->m_head == (ListNode<MeshLib::Token> *)0x0) {
    this->m_head = tn;
    ppLVar1 = ListNode<MeshLib::Token>::next(this->m_head);
    *ppLVar1 = (ListNode<MeshLib::Token> *)0x0;
    this->m_size = this->m_size + 1;
  }
  else {
    local_20 = this->m_head;
    while( true ) {
      ppLVar1 = ListNode<MeshLib::Token>::next(local_20);
      if (*ppLVar1 == (ListNode<MeshLib::Token> *)0x0) break;
      ppLVar1 = ListNode<MeshLib::Token>::next(local_20);
      local_20 = *ppLVar1;
    }
    ppLVar1 = ListNode<MeshLib::Token>::next(local_20);
    *ppLVar1 = tn;
    ppLVar1 = ListNode<MeshLib::Token>::next(tn);
    *ppLVar1 = (ListNode<MeshLib::Token> *)0x0;
    this->m_size = this->m_size + 1;
  }
  return;
}

Assistant:

void List<T>::append( ListNode<T> * tn )
{
	if( m_head == NULL )
	{
		m_head = tn;
		m_head->next() = NULL;
		m_size ++;
		return;
	}

	ListNode<T> * n = m_head;
	while( n->next() != NULL )
	{
		n = n->next();
	}

	n->next() = tn;
	tn->next() = NULL;
	m_size ++;
}